

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

bool __thiscall
pbrt::Bounds3<float>::IntersectP
          (Bounds3<float> *this,Point3f *o,Vector3f *d,Float raytMax,Vector3f *invDir,int *dirIsNeg)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  byte bVar11;
  Bounds3<float> *pBVar12;
  Bounds3<float> *pBVar13;
  Bounds3<float> *pBVar14;
  Bounds3<float> *pBVar15;
  Bounds3<float> *pBVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  auVar19._4_60_ = in_register_00001204;
  auVar19._0_4_ = raytMax;
  pBVar12 = (Bounds3<float> *)&this->pMax;
  uVar3 = (o->super_Tuple3<pbrt::Point3,_float>).x;
  uVar5 = (o->super_Tuple3<pbrt::Point3,_float>).y;
  auVar20._4_4_ = uVar5;
  auVar20._0_4_ = uVar3;
  auVar20._8_8_ = 0;
  uVar4 = (invDir->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar6 = (invDir->super_Tuple3<pbrt::Vector3,_float>).y;
  pBVar14 = pBVar12;
  if (*dirIsNeg == 0) {
    pBVar14 = this;
  }
  pBVar13 = pBVar12;
  if (*dirIsNeg == 1) {
    pBVar13 = this;
  }
  pBVar16 = pBVar12;
  if (dirIsNeg[1] == 0) {
    pBVar16 = this;
  }
  pBVar15 = pBVar12;
  if (dirIsNeg[1] == 1) {
    pBVar15 = this;
  }
  auVar17 = vinsertps_avx(ZEXT416((uint)(pBVar14->pMin).super_Tuple3<pbrt::Point3,_float>.x),
                          ZEXT416((uint)(pBVar16->pMin).super_Tuple3<pbrt::Point3,_float>.y),0x10);
  auVar21 = vinsertps_avx(ZEXT416((uint)(pBVar13->pMin).super_Tuple3<pbrt::Point3,_float>.x),
                          ZEXT416((uint)(pBVar15->pMin).super_Tuple3<pbrt::Point3,_float>.y),0x10);
  auVar17 = vsubps_avx(auVar17,auVar20);
  auVar20 = vsubps_avx(auVar21,auVar20);
  auVar22._0_4_ = auVar17._0_4_ * (float)uVar4;
  auVar22._4_4_ = auVar17._4_4_ * (float)uVar6;
  auVar22._8_4_ = auVar17._8_4_ * 0.0;
  auVar22._12_4_ = auVar17._12_4_ * 0.0;
  auVar21._0_4_ = (float)uVar4 * auVar20._0_4_;
  auVar21._4_4_ = (float)uVar6 * auVar20._4_4_;
  auVar21._8_4_ = auVar20._8_4_ * 0.0;
  auVar21._12_4_ = auVar20._12_4_ * 0.0;
  auVar17._8_4_ = 0x3f800003;
  auVar17._0_8_ = 0x3f8000033f800003;
  auVar17._12_4_ = 0x3f800003;
  auVar17 = vmulps_avx512vl(auVar21,auVar17);
  auVar20 = vshufps_avx(auVar17,auVar17,0xe1);
  uVar8 = vcmpps_avx512vl(auVar20,auVar22,1);
  if ((uVar8 & 3) == 0) {
    auVar20 = vmovshdup_avx(auVar22);
    fVar1 = (o->super_Tuple3<pbrt::Point3,_float>).z;
    fVar2 = (invDir->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar20 = vmaxss_avx(auVar20,auVar22);
    pBVar14 = pBVar12;
    if (dirIsNeg[2] == 0) {
      pBVar14 = this;
    }
    if (dirIsNeg[2] == 1) {
      pBVar12 = this;
    }
    bVar11 = 0;
    fVar7 = fVar2 * ((pBVar12->pMin).super_Tuple3<pbrt::Point3,_float>.z - fVar1) * 1.0000004;
    if (auVar20._0_4_ <= fVar7) {
      auVar21 = vmovshdup_avx(auVar17);
      auVar17 = vminss_avx(auVar21,auVar17);
      fVar2 = ((pBVar14->pMin).super_Tuple3<pbrt::Point3,_float>.z - fVar1) * fVar2;
      if (fVar2 <= auVar17._0_4_) {
        auVar20 = vmaxss_avx(ZEXT416((uint)fVar2),auVar20);
        auVar17 = vminss_avx(ZEXT416((uint)fVar7),auVar17);
        uVar9 = vcmpps_avx512vl(auVar20,auVar19._0_16_,1);
        auVar18._0_12_ = ZEXT412(0);
        auVar18._12_4_ = 0;
        uVar10 = vcmpps_avx512vl(auVar18,auVar17,1);
        bVar11 = (byte)uVar9 & (byte)uVar10;
      }
    }
  }
  else {
    bVar11 = 0;
  }
  return (bool)(bVar11 & 1);
}

Assistant:

PBRT_CPU_GPU inline bool Bounds3<T>::IntersectP(const Point3f &o, const Vector3f &d,
                                                Float raytMax, const Vector3f &invDir,
                                                const int dirIsNeg[3]) const {
    const Bounds3f &bounds = *this;
    // Check for ray intersection against $x$ and $y$ slabs
    Float tMin = (bounds[dirIsNeg[0]].x - o.x) * invDir.x;
    Float tMax = (bounds[1 - dirIsNeg[0]].x - o.x) * invDir.x;
    Float tyMin = (bounds[dirIsNeg[1]].y - o.y) * invDir.y;
    Float tyMax = (bounds[1 - dirIsNeg[1]].y - o.y) * invDir.y;
    // Update _tMax_ and _tyMax_ to ensure robust bounds intersection
    tMax *= 1 + 2 * gamma(3);
    tyMax *= 1 + 2 * gamma(3);

    if (tMin > tyMax || tyMin > tMax)
        return false;
    if (tyMin > tMin)
        tMin = tyMin;
    if (tyMax < tMax)
        tMax = tyMax;

    // Check for ray intersection against $z$ slab
    Float tzMin = (bounds[dirIsNeg[2]].z - o.z) * invDir.z;
    Float tzMax = (bounds[1 - dirIsNeg[2]].z - o.z) * invDir.z;
    // Update _tzMax_ to ensure robust bounds intersection
    tzMax *= 1 + 2 * gamma(3);

    if (tMin > tzMax || tzMin > tMax)
        return false;
    if (tzMin > tMin)
        tMin = tzMin;
    if (tzMax < tMax)
        tMax = tzMax;

    return (tMin < raytMax) && (tMax > 0);
}